

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

void __thiscall QSQLiteResult::~QSQLiteResult(QSQLiteResult *this)

{
  QSQLiteResultPrivate *this_00;
  long lVar1;
  EVP_PKEY_CTX *in_RSI;
  long in_FS_OFFSET;
  bool bVar2;
  QSQLiteResult *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QSQLiteResult_0023ca20;
  this_00 = *(QSQLiteResultPrivate **)&this->field_0x8;
  lVar1 = *(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x10;
  if (lVar1 != 0) {
    bVar2 = *(int *)(lVar1 + 4) != 0;
    lVar1 = *(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18;
    in_RSI = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)in_RSI >> 8),lVar1 != 0 && bVar2);
    if ((lVar1 != 0 && bVar2) && (*(long *)(lVar1 + 8) != 0)) {
      in_RSI = (EVP_PKEY_CTX *)&local_20;
      local_20 = this;
      QtPrivate::sequential_erase_one<QList<QSQLiteResult*>,QSQLiteResult*>
                ((QList<QSQLiteResult_*> *)
                 (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8) +
                 0xb0),(QSQLiteResult **)in_RSI);
    }
  }
  QSQLiteResultPrivate::cleanup(this_00,in_RSI);
  QSqlResult::~QSqlResult((QSqlResult *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSQLiteResult::~QSQLiteResult()
{
    Q_D(QSQLiteResult);
    if (d->drv_d_func())
        const_cast<QSQLiteDriverPrivate*>(d->drv_d_func())->results.removeOne(this);
    d->cleanup();
}